

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_split_clients_module.c
# Opt level: O1

char * ngx_http_split_clients(ngx_conf_t *cf,ngx_command_t *dummy,void *conf)

{
  long *plVar1;
  long lVar2;
  undefined4 *puVar3;
  ngx_int_t nVar4;
  char *pcVar5;
  
  plVar1 = (long *)cf->args->elts;
  puVar3 = (undefined4 *)ngx_array_push((ngx_array_t *)((long)cf->ctx + 0x28));
  pcVar5 = (char *)0xffffffffffffffff;
  if (puVar3 != (undefined4 *)0x0) {
    lVar2 = *plVar1;
    if ((lVar2 == 0) ||
       (((lVar2 != 1 || (nVar4 = 0, *(char *)plVar1[1] != '*')) &&
        ((((u_char *)plVar1[1])[lVar2 + -1] != '%' ||
         (nVar4 = ngx_atofp((u_char *)plVar1[1],lVar2 - 1,2), nVar4 + 1U < 2)))))) {
      ngx_conf_log_error(1,cf,0,"invalid percent value \"%V\"",plVar1);
    }
    else {
      *puVar3 = (int)nVar4;
      puVar3[2] = (*(uint *)(plVar1 + 2) & 0xfffffff) + (puVar3[2] & 0x80000000) + 0x10000000;
      *(long *)(puVar3 + 4) = plVar1[3];
      pcVar5 = (char *)0x0;
    }
  }
  return pcVar5;
}

Assistant:

static char *
ngx_http_split_clients(ngx_conf_t *cf, ngx_command_t *dummy, void *conf)
{
    ngx_int_t                       n;
    ngx_str_t                      *value;
    ngx_http_split_clients_ctx_t   *ctx;
    ngx_http_split_clients_part_t  *part;

    ctx = cf->ctx;
    value = cf->args->elts;

    part = ngx_array_push(&ctx->parts);
    if (part == NULL) {
        return NGX_CONF_ERROR;
    }

    if (value[0].len == 1 && value[0].data[0] == '*') {
        part->percent = 0;

    } else {
        if (value[0].len == 0 || value[0].data[value[0].len - 1] != '%') {
            goto invalid;
        }

        n = ngx_atofp(value[0].data, value[0].len - 1, 2);
        if (n == NGX_ERROR || n == 0) {
            goto invalid;
        }

        part->percent = (uint32_t) n;
    }

    part->value.len = value[1].len;
    part->value.valid = 1;
    part->value.no_cacheable = 0;
    part->value.not_found = 0;
    part->value.data = value[1].data;

    return NGX_CONF_OK;

invalid:

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                       "invalid percent value \"%V\"", &value[0]);
    return NGX_CONF_ERROR;
}